

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sendf.c
# Opt level: O0

CURLcode Curl_read_plain(curl_socket_t sockfd,char *buf,size_t bytesfromsocket,ssize_t *n)

{
  int iVar1;
  ssize_t sVar2;
  int *piVar3;
  bool bVar4;
  int return_error;
  int err;
  ssize_t nread;
  ssize_t *n_local;
  size_t bytesfromsocket_local;
  char *buf_local;
  curl_socket_t sockfd_local;
  
  sVar2 = recv(sockfd,buf,bytesfromsocket,0);
  if (sVar2 == -1) {
    piVar3 = __errno_location();
    iVar1 = *piVar3;
    bVar4 = true;
    if ((iVar1 != 0xb) && (bVar4 = true, iVar1 != 0xb)) {
      bVar4 = iVar1 == 4;
    }
    if (bVar4) {
      buf_local._4_4_ = CURLE_AGAIN;
    }
    else {
      buf_local._4_4_ = CURLE_RECV_ERROR;
    }
  }
  else {
    *n = sVar2;
    buf_local._4_4_ = CURLE_OK;
  }
  return buf_local._4_4_;
}

Assistant:

CURLcode Curl_read_plain(curl_socket_t sockfd,
                         char *buf,
                         size_t bytesfromsocket,
                         ssize_t *n)
{
  ssize_t nread = sread(sockfd, buf, bytesfromsocket);

  if(-1 == nread) {
    int err = SOCKERRNO;
    int return_error;
#ifdef USE_WINSOCK
    return_error = WSAEWOULDBLOCK == err;
#else
    return_error = EWOULDBLOCK == err || EAGAIN == err || EINTR == err;
#endif
    if(return_error)
      return CURLE_AGAIN;
    else
      return CURLE_RECV_ERROR;
  }

  /* we only return number of bytes read when we return OK */
  *n = nread;
  return CURLE_OK;
}